

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_api.c
# Opt level: O2

MPP_RET hal_h265d_init(void *ctx,MppHalCfg *cfg)

{
  MppDecCfgSet *pMVar1;
  MppBufSlots pvVar2;
  RK_U32 RVar3;
  RockchipSocType RVar4;
  MPP_RET MVar5;
  MppDecHwCap *pMVar6;
  MppHalApi *pMVar7;
  MppClientType type;
  byte bVar8;
  
  RVar3 = mpp_get_vcodec_type();
  RVar4 = mpp_get_soc_type();
  if ((RVar3 & 0x300) == 0) {
    _mpp_log_l(2,"hal_h265d_api","Can not found valid H.265 decoder hardware on platform %08x\n",
               "hal_h265d_init",(ulong)RVar3);
    return MPP_NOK;
  }
  type = VPU_CLIENT_RKVDEC - ((RVar3 >> 8 & 1) != 0);
  MVar5 = mpp_dev_init(&cfg->dev,type);
  if (MVar5 != MPP_OK) {
    _mpp_log_l(2,"hal_h265d_api","mpp_dev_init failed ret: %d\n",(char *)0x0,(ulong)(uint)MVar5);
    return MVar5;
  }
  pMVar6 = mpp_get_dec_hw_info_by_client_type(type);
  cfg->hw_info = pMVar6;
  *(MppDecHwCap **)((long)ctx + 0x230) = pMVar6;
  RVar3 = mpp_get_client_hw_id(type);
  bVar8 = 4;
  if (RVar3 != 0x32a3f03) {
    bVar8 = (RVar3 == 0x53813f05) << 2;
  }
  *(MppDev *)((long)ctx + 0x10) = cfg->dev;
  *(byte *)((long)ctx + 0x1b8) =
       (RVar3 == 0xdbdc0701) * '\x02' | (RVar4 & ~ROCKCHIP_SOC_RK3036) == ROCKCHIP_SOC_RK3228H |
       (RVar3 == 0x38321746) << 3 | (RVar3 == 0x38436021) << 4 | bVar8 |
       *(byte *)((long)ctx + 0x1b8) & 0xe0;
  *(MppClientType *)((long)ctx + 8) = type;
  if (RVar3 != 0x32a3f03) {
    pMVar7 = &hal_h265d_vdpu382;
    if ((RVar3 == 0x72bb0f01) || (RVar3 == 0x70393f05)) goto LAB_001e1e79;
    if (RVar3 != 0x53813f05) {
      if (RVar3 == 0x38436021) {
        pMVar7 = &hal_h265d_vdpu384a;
      }
      else {
        pMVar7 = &hal_h265d_rkv;
      }
      if (RVar3 == 0x38321746) {
        pMVar7 = &hal_h265d_vdpu383;
      }
      goto LAB_001e1e79;
    }
  }
  pMVar7 = &hal_h265d_vdpu34x;
LAB_001e1e79:
  *(MppHalApi **)ctx = pMVar7;
  cfg->support_fast_mode = 1;
  pMVar1 = cfg->cfg;
  *(MppDecCfgSet **)((long)ctx + 0x18) = pMVar1;
  *(MppCbCtx **)((long)ctx + 0x188) = cfg->dec_cb;
  *(RK_U32 *)((long)ctx + 0x180) = (pMVar1->base).fast_parse;
  pvVar2 = cfg->packet_slots;
  *(MppBufSlots *)((long)ctx + 0x20) = cfg->frame_slots;
  *(MppBufSlots *)((long)ctx + 0x28) = pvVar2;
  mpp_env_get_u32("hal_h265d_debug",&hal_h265d_debug,0);
  MVar5 = (**(code **)(*ctx + 0x18))(ctx,cfg);
  return MVar5;
}

Assistant:

MPP_RET hal_h265d_init(void *ctx, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_NOK;
    HalH265dCtx *p = (HalH265dCtx *)ctx;
    MppClientType client_type = VPU_CLIENT_BUTT;
    RK_U32 vcodec_type = mpp_get_vcodec_type();
    RockchipSocType soc = mpp_get_soc_type();
    RK_U32 hw_id = 0;

    if (!(vcodec_type & (HAVE_RKVDEC | HAVE_HEVC_DEC))) {
        mpp_err_f("Can not found valid H.265 decoder hardware on platform %08x\n", vcodec_type);
        return ret;
    }

    client_type = (vcodec_type & HAVE_HEVC_DEC) ?
                  VPU_CLIENT_HEVC_DEC : VPU_CLIENT_RKVDEC;

    ret = mpp_dev_init(&cfg->dev, client_type);
    if (ret) {
        mpp_err("mpp_dev_init failed ret: %d\n", ret);
        return ret;
    }
    cfg->hw_info = mpp_get_dec_hw_info_by_client_type(client_type);
    p->hw_info = cfg->hw_info;

    hw_id = mpp_get_client_hw_id(client_type);
    p->dev = cfg->dev;
    p->is_v341 = (soc == ROCKCHIP_SOC_RK3228H || (soc == ROCKCHIP_SOC_RK3328));
    p->is_v345 = (hw_id == HWID_VDPU345);
    p->is_v34x = (hw_id == HWID_VDPU34X || hw_id == HWID_VDPU38X);
    p->is_v383 = (hw_id == HWID_VDPU383);
    p->is_v384a = (hw_id == HWID_VDPU384A);
    p->client_type = client_type;

    if (hw_id == HWID_VDPU382_RK3528 || hw_id == HWID_VDPU382_RK3562)
        p->api = &hal_h265d_vdpu382;
    else if (p->is_v34x)
        p->api = &hal_h265d_vdpu34x;
    else if (p->is_v383)
        p->api = &hal_h265d_vdpu383;
    else if (p->is_v384a)
        p->api = &hal_h265d_vdpu384a;
    else
        p->api = &hal_h265d_rkv;

    cfg->support_fast_mode = 1;

    p->cfg = cfg->cfg;
    p->slots = cfg->frame_slots;
    p->dec_cb = cfg->dec_cb;
    p->fast_mode = cfg->cfg->base.fast_parse;
    p->packet_slots = cfg->packet_slots;

    mpp_env_get_u32("hal_h265d_debug", &hal_h265d_debug, 0);

    ret = p->api->init(ctx, cfg);

    return ret;
}